

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O0

void __thiscall
TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubMeshAnalysis *this,TPZSubCompMesh *mesh)

{
  undefined8 in_RSI;
  TPZRegisterClassId *in_RDI;
  ostream *obj;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 mustOptimizeBandwidth;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  TPZFMatrix<double> *in_stack_ffffffffffffffd8;
  TPZCompMesh *this_00;
  
  mustOptimizeBandwidth = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  this_00 = (TPZCompMesh *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZSubMeshAnalysis>(in_RDI,0x21);
  TPZLinearAnalysis::TPZLinearAnalysis
            ((TPZLinearAnalysis *)this_00,(void **)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,(bool)mustOptimizeBandwidth,(ostream *)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZSubMeshAnalysis_0252ce40;
  obj = (ostream *)in_RDI + 0x488;
  TPZFMatrix<double>::TPZFMatrix((TPZFMatrix<double> *)this_00);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffffd0,
             (TPZMatrix<double> *)obj);
  *(undefined8 *)((ostream *)in_RDI + 0x520) = in_RSI;
  if (*(long *)((ostream *)in_RDI + 0x520) != 0) {
    TPZCompMesh::NEquations(this_00);
    TPZFMatrix<double>::Redim
              (in_stack_ffffffffffffffd8,(int64_t)in_stack_ffffffffffffffd0,(int64_t)obj);
  }
  return;
}

Assistant:

TPZSubMeshAnalysis::TPZSubMeshAnalysis(TPZSubCompMesh *mesh) : TPZRegisterClassId(&TPZSubMeshAnalysis::ClassId),
TPZLinearAnalysis(mesh,true), fReducableStiff(0){
	fMesh = mesh;
    if (fMesh)
    {
        fReferenceSolution.Redim(fCompMesh->NEquations(),1);
    }
}